

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_union_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_union_verifier_f *uvf)

{
  flatbuffers_utype_t fVar1;
  ushort uVar2;
  void *pvVar3;
  ushort uVar4;
  int iVar5;
  uint16_t in_R8W;
  ulong uVar6;
  bool bVar7;
  flatbuffers_uoffset_t base;
  flatcc_union_verifier_descriptor_t local_50;
  
  uVar4 = id * 2 + 2;
  uVar2 = td->vsize;
  if (uVar4 < uVar2) {
    pvVar3 = td->vtable;
    uVar6 = (ulong)*(ushort *)((long)pvVar3 + (ulong)uVar4);
    if (uVar6 != 0) {
      iVar5 = verify_field(td,id - 1,1,1,in_R8W);
      if (iVar5 != 0) {
        return iVar5;
      }
      uVar4 = id * 2 + 4;
      bVar7 = true;
      if (uVar4 < uVar2) {
        bVar7 = *(short *)((long)pvVar3 + (ulong)uVar4) == 0;
      }
      pvVar3 = td->buf;
      fVar1 = *(flatbuffers_utype_t *)((long)pvVar3 + uVar6 + td->table);
      if ((fVar1 == '\0') && (!bVar7)) {
        return 0x18;
      }
      if (fVar1 == '\0') {
        return 0;
      }
      iVar5 = get_offset_field(td,id,required,&base);
      if (base == 0 || iVar5 != 0) {
        return iVar5;
      }
      local_50.end = td->end;
      local_50.ttl = td->ttl;
      local_50.base = base;
      local_50.offset = *(flatbuffers_uoffset_t *)((long)pvVar3 + (ulong)base);
      local_50.buf = pvVar3;
      local_50.type = fVar1;
      iVar5 = (*uvf)(&local_50);
      return iVar5;
    }
  }
  uVar4 = id * 2 + 4;
  if ((uVar4 < uVar2) && (*(short *)((long)td->vtable + (ulong)uVar4) != 0)) {
    iVar5 = 0x17;
  }
  else {
    iVar5 = 0x15;
    if (required == 0) {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int flatcc_verify_union_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, flatcc_union_verifier_f uvf)
{
    voffset_t vte_type, vte_table;
    const uint8_t *type;
    uoffset_t base;
    flatcc_union_verifier_descriptor_t ud;

    if (0 == (vte_type = read_vt_entry(td, id - 1))) {
        vte_table = read_vt_entry(td, id);
        verify(vte_table == 0, flatcc_verify_error_union_cannot_have_a_table_without_a_type);
        verify(!required, flatcc_verify_error_type_field_absent_from_required_union_field);
        return flatcc_verify_ok;
    }
    /* No need to check required here. */
    check_result(verify_field(td, id - 1, 0, 1, 1));
    /* Only now is it safe to read the type. */
    vte_table = read_vt_entry(td, id);
    type = (const uint8_t *)td->buf + td->table + vte_type;
    verify(*type || vte_table == 0, flatcc_verify_error_union_type_NONE_cannot_have_a_value);

    if (*type == 0) {
        return flatcc_verify_ok;
    }
    check_field(td, id, required, base);
    ud.buf = td->buf;
    ud.end = td->end;
    ud.ttl = td->ttl;
    ud.base = base;
    ud.offset = read_uoffset(td->buf, base);
    ud.type = *type;
    return uvf(&ud);
}